

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_bb64a::GraphEdgeClipper::GatherIncidentEdges
          (GraphEdgeClipper *this,vector<int,_std::allocator<int>_> *a,int ai,
          vector<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
          *b_input_edges,
          vector<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
          *b_edges)

{
  int iVar1;
  pointer piVar2;
  pointer pCVar3;
  pointer pCVar4;
  ulong uVar5;
  long lVar6;
  pointer pCVar7;
  ulong uVar8;
  EdgeId e;
  int iVar9;
  int *piVar10;
  long lVar11;
  value_type local_50;
  long local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  if ((long)(b_input_edges->
            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(b_input_edges->
            super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
            )._M_impl.super__Vector_impl_data._M_start >> 2 ==
      ((long)(b_edges->
             super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(b_edges->
             super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
    lVar6 = (long)(a->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                  ._M_start[ai];
    piVar2 = (this->in_).in_edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = piVar2[lVar6];
    iVar1 = piVar2[lVar6 + 1];
    if (iVar9 != iVar1) {
      piVar2 = (this->in_).in_edge_ids_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar10 = piVar2 + iVar9;
      local_40 = (long)ai;
      local_38 = a;
      do {
        local_50.id = *piVar10;
        iVar9 = (this->input_ids_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_50.id];
        pCVar3 = (b_input_edges->
                 super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar4 = (b_input_edges->
                 super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pCVar7 = pCVar3;
        uVar8 = (long)pCVar4 - (long)pCVar3 >> 2;
        while (uVar5 = uVar8, 0 < (long)uVar5) {
          uVar8 = uVar5 >> 1;
          if ((int)pCVar7[uVar8] >> 1 < iVar9) {
            pCVar7 = pCVar7 + uVar8 + 1;
            uVar8 = ~uVar8 + uVar5;
          }
        }
        if ((pCVar7 != pCVar4) && ((int)*pCVar7 >> 1 == iVar9)) {
          local_50.dst = (this->g_->edges_->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[local_50.id].first;
          local_50._8_4_ = local_50._8_4_ & 0xffffff00;
          local_50.a_index = ai;
          absl::
          InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
          ::push_back((b_edges->
                      super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start +
                      ((ulong)((long)pCVar7 - (long)pCVar3) >> 2),&local_50);
        }
        piVar10 = piVar10 + 1;
      } while (piVar10 != piVar2 + iVar1);
      lVar6 = (long)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[local_40];
    }
    piVar2 = (this->out_).edge_begins_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = piVar2[lVar6];
    lVar11 = (long)iVar9;
    iVar1 = piVar2[lVar6 + 1];
    while (iVar9 != iVar1) {
      iVar9 = (this->input_ids_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      pCVar3 = (b_input_edges->
               super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pCVar4 = (b_input_edges->
               super__Vector_base<(anonymous_namespace)::CrossingInputEdge,_std::allocator<(anonymous_namespace)::CrossingInputEdge>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pCVar7 = pCVar3;
      uVar8 = (long)pCVar4 - (long)pCVar3 >> 2;
      while (uVar5 = uVar8, 0 < (long)uVar5) {
        uVar8 = uVar5 >> 1;
        if ((int)pCVar7[uVar8] >> 1 < iVar9) {
          pCVar7 = pCVar7 + uVar8 + 1;
          uVar8 = ~uVar8 + uVar5;
        }
      }
      if ((pCVar7 != pCVar4) && ((int)*pCVar7 >> 1 == iVar9)) {
        local_50.dst = (this->g_->edges_->
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[lVar11].second;
        local_50.id = (EdgeId)lVar11;
        local_50._9_3_ = SUB43((uint)local_50._8_4_ >> 8,0);
        local_50.outgoing = true;
        local_50.a_index = ai;
        absl::
        InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
        ::push_back((b_edges->
                    super__Vector_base<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>,_std::allocator<absl::InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start +
                    ((ulong)((long)pCVar7 - (long)pCVar3) >> 2),&local_50);
      }
      lVar11 = lVar11 + 1;
      iVar9 = (int)lVar11;
    }
    return;
  }
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x1f1,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)CONCAT44(local_50.dst,local_50._8_4_),
             "Check failed: (b_input_edges.size()) == (b_edges->size()) ",0x3a);
  abort();
}

Assistant:

void GraphEdgeClipper::GatherIncidentEdges(
    const vector<VertexId>& a, int ai,
    const vector<CrossingInputEdge>& b_input_edges,
    vector<CrossingGraphEdgeVector>* b_edges) const {
  // Examine all of the edges incident to the given vertex of A.  If any edge
  // comes from a B input edge, append it to the appropriate vector.
  S2_DCHECK_EQ(b_input_edges.size(), b_edges->size());
  for (EdgeId e : in_.edge_ids(a[ai])) {
    InputEdgeId id = input_ids_[e];
    auto it = lower_bound(b_input_edges.begin(), b_input_edges.end(), id);
    if (it != b_input_edges.end() && it->input_id() == id) {
      auto& edges = (*b_edges)[it - b_input_edges.begin()];
      edges.push_back(CrossingGraphEdge(e, ai, false, g_.edge(e).first));
    }
  }
  for (EdgeId e : out_.edge_ids(a[ai])) {
    InputEdgeId id = input_ids_[e];
    auto it = lower_bound(b_input_edges.begin(), b_input_edges.end(), id);
    if (it != b_input_edges.end() && it->input_id() == id) {
      auto& edges = (*b_edges)[it - b_input_edges.begin()];
      edges.push_back(CrossingGraphEdge(e, ai, true, g_.edge(e).second));
    }
  }
}